

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O3

void Minisat::skipWhitespace<Minisat::StreamBuffer>(StreamBuffer *in)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = in->pos;
  if (iVar2 < in->size) {
    do {
      bVar1 = in->buf[iVar2];
      if (bVar1 < 9) {
        return;
      }
      if (0xd < bVar1 && bVar1 != 0x20) {
        return;
      }
      in->pos = iVar2 + 1;
      StreamBuffer::assureLookahead(in);
      iVar2 = in->pos;
    } while (iVar2 < in->size);
  }
  return;
}

Assistant:

int  operator *  () const { return (pos >= size) ? EOF : buf[pos]; }